

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.h
# Opt level: O3

QString * __thiscall
MakefileGenerator::
escapeDependencyPath<QStringBuilder<QStringBuilder<QStringBuilder<ProString&,ProString>,ProString_const&>,char>,ProString>
          (QString *__return_storage_ptr__,MakefileGenerator *this,
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString_&,_ProString>,_const_ProString_&>,_char>,_ProString>
          *path)

{
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString_&,_ProString>,_const_ProString_&>,_char>,_ProString>
  ::convertTo<QString>(&local_38,path);
  (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])
            (__return_storage_ptr__,this,&local_38);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString escapeDependencyPath(const QStringBuilder<A, B> &path) const
    { return escapeDependencyPath(QString(path)); }